

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O2

int json_object_update(json_t *object,json_t *other)

{
  int iVar1;
  void *iter;
  char *key;
  json_t *value;
  int iVar2;
  
  if ((((object == (json_t *)0x0) || (other == (json_t *)0x0)) || (object->type != JSON_OBJECT)) ||
     (other->type != JSON_OBJECT)) {
LAB_0010905f:
    iVar2 = -1;
  }
  else {
    iter = json_object_iter(other);
    iVar2 = 0;
    while (key = json_object_iter_key(iter), key != (char *)0x0) {
      value = json_object_iter_value(key + -0x20);
      if (value == (json_t *)0x0) {
        return 0;
      }
      iVar1 = json_object_set_nocheck(object,key,value);
      if (iVar1 != 0) goto LAB_0010905f;
      iter = json_object_iter_next(other,key + -0x20);
    }
  }
  return iVar2;
}

Assistant:

int json_object_update(json_t *object, json_t *other)
{
	const char *key;
	json_t *value;

	if (!json_is_object(object) || !json_is_object(other))
		return -1;

	json_object_foreach(other, key, value) {
		if (json_object_set_nocheck(object, key, value))
			return -1;
	}

	return 0;
}